

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::Destroy<duckdb::QuantileState<float,duckdb::QuantileStandardType>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,
               AggregateInputData *param_2)

{
  _Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false> __ptr;
  _Head_base<0UL,_duckdb::WindowQuantileState<float>_*,_false> __ptr_00;
  pointer pfVar1;
  
  __ptr._M_head_impl =
       (state->window_cursor).
       super_unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
       .super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (QuantileCursor<float> *)0x0) {
    ::std::default_delete<duckdb::QuantileCursor<float>_>::operator()
              ((default_delete<duckdb::QuantileCursor<float>_> *)&state->window_cursor,
               __ptr._M_head_impl);
  }
  (state->window_cursor).
  super_unique_ptr<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::QuantileCursor<float>,_std::default_delete<duckdb::QuantileCursor<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::QuantileCursor<float>_*,_std::default_delete<duckdb::QuantileCursor<float>_>_>
  .super__Head_base<0UL,_duckdb::QuantileCursor<float>_*,_false>._M_head_impl =
       (QuantileCursor<float> *)0x0;
  __ptr_00._M_head_impl =
       (state->window_state).
       super_unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowQuantileState<float>_*,_std::default_delete<duckdb::WindowQuantileState<float>_>_>
       .super__Head_base<0UL,_duckdb::WindowQuantileState<float>_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (WindowQuantileState<float> *)0x0) {
    ::std::default_delete<duckdb::WindowQuantileState<float>_>::operator()
              ((default_delete<duckdb::WindowQuantileState<float>_> *)&state->window_state,
               __ptr_00._M_head_impl);
  }
  (state->window_state).
  super_unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowQuantileState<float>_*,_std::default_delete<duckdb::WindowQuantileState<float>_>_>
  .super__Head_base<0UL,_duckdb::WindowQuantileState<float>_*,_false>._M_head_impl =
       (WindowQuantileState<float> *)0x0;
  pfVar1 = (state->v).super_vector<float,_std::allocator<float>_>.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
    return;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}